

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_map.h
# Opt level: O2

iterator __thiscall
cppcms::impl::details::basic_map<$7159f324$>::allocate(basic_map<_7159f324_> *this,value_type *v)

{
  container *this_00;
  
  this_00 = (container *)operator_new(0x50);
  container::container(this_00,v);
  return this_00;
}

Assistant:

iterator allocate(value_type const &v)
	{
		container_alloc al;
		iterator p = al.allocate(1);
		try {
			new (p) container(v);
		}
		catch(...) {
			al.deallocate(p,1);
			throw;
		}
		return p;
	}